

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_36::HttpFixedLengthEntityWriter::write
          (HttpFixedLengthEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  HttpEntityBodyWriter *this_00;
  bool bVar1;
  undefined8 *puVar2;
  Coroutine<void> *this_01;
  size_t sVar3;
  HttpOutputStream *pHVar4;
  Promise<void> *promise;
  ulong uVar5;
  ArrayPtr<const_unsigned_char> *this_02;
  suspend_never *this_03;
  PromiseAwaiter<void> *__return_storage_ptr__;
  HttpOutputStream *this_04;
  suspend_always *this_05;
  SourceLocation *__n_00;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int __fd_00;
  undefined4 in_register_00000034;
  ArrayPtr<const_unsigned_char> buffer;
  Fault local_2d0;
  Fault f;
  DebugExpression<unsigned_long> local_2c0;
  undefined1 local_2b8 [8];
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  HttpFixedLengthEntityWriter *this_local;
  ArrayPtr<const_unsigned_char> buffer_local;
  
  puVar2 = (undefined8 *)operator_new(0x438);
  *puVar2 = write;
  puVar2[1] = write;
  this_02 = (ArrayPtr<const_unsigned_char> *)(puVar2 + 0x81);
  __n_00 = (SourceLocation *)(puVar2 + 0x7e);
  this_03 = (suspend_never *)((long)puVar2 + 0x435);
  __return_storage_ptr__ = (PromiseAwaiter<void> *)(puVar2 + 0x47);
  this_04 = (HttpOutputStream *)(puVar2 + 0x84);
  this_05 = (suspend_always *)((long)puVar2 + 0x436);
  this_01 = (Coroutine<void> *)(puVar2 + 2);
  puVar2[0x85] = CONCAT44(in_register_00000034,__fd);
  this_02->ptr = (uchar *)__buf;
  puVar2[0x82] = __n;
  SourceLocation::SourceLocation
            (__n_00,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"write",0x9a8,0x11);
  kj::_::Coroutine<void>::Coroutine(this_01,*__n_00);
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_01);
  bVar1 = std::__n4861::suspend_never::await_ready(this_03);
  __fd_00 = (int)puVar2;
  if (bVar1) {
    std::__n4861::suspend_never::await_resume(this_03);
    bVar1 = ArrayPtr<const_unsigned_char>::operator==(this_02,(void *)0x0);
    if (bVar1) {
      kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
                ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_01);
    }
    else {
      f.exception = (Exception *)ArrayPtr<const_unsigned_char>::size(this_02);
      local_2c0 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(unsigned_long *)&f);
      kj::_::DebugExpression<unsigned_long>::operator<=
                ((DebugComparison<unsigned_long,_unsigned_long_&> *)local_2b8,&local_2c0,
                 (unsigned_long *)(puVar2[0x85] + 0x18));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2b8);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&,char_const(&)[25]>
                  (&local_2d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x9aa,FAILED,"buffer.size() <= length",
                   "_kjCondition,\"overwrote Content-Length\"",
                   (DebugComparison<unsigned_long,_unsigned_long_&> *)local_2b8,
                   (char (*) [25])"overwrote Content-Length");
        kj::_::Debug::Fault::fatal(&local_2d0);
      }
      sVar3 = ArrayPtr<const_unsigned_char>::size(this_02);
      this_00 = (HttpEntityBodyWriter *)puVar2[0x85];
      this_00[1].super_AsyncOutputStream._vptr_AsyncOutputStream =
           (_func_int **)((long)this_00[1].super_AsyncOutputStream._vptr_AsyncOutputStream - sVar3);
      pHVar4 = HttpEntityBodyWriter::getInner(this_00);
      __n_00 = (SourceLocation *)puVar2[0x82];
      buffer.size_ = (size_t)this_02->ptr;
      buffer.ptr = (uchar *)pHVar4;
      HttpOutputStream::writeBodyData(this_04,buffer);
      promise = kj::_::Coroutine<void>::await_transform<kj::Promise<void>>
                          (this_01,(Promise<void> *)this_04);
      co_await<void>(__return_storage_ptr__,promise);
      bVar1 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
      if (!bVar1) {
        *(undefined1 *)((long)puVar2 + 0x434) = 1;
        uVar5 = _GLOBAL__N_1::HttpFixedLengthEntityWriter::write
                          (__return_storage_ptr__,__fd_00,__buf_01,(size_t)__n_00);
        if ((uVar5 & 1) != 0) {
          return (ssize_t)this;
        }
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
      Promise<void>::~Promise((Promise<void> *)this_04);
      if (*(long *)(puVar2[0x85] + 0x18) == 0) {
        HttpEntityBodyWriter::doneWriting((HttpEntityBodyWriter *)puVar2[0x85]);
      }
      kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
                ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_01);
    }
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_01);
    bVar1 = std::__n4861::suspend_always::await_ready(this_05);
    if (bVar1) {
      std::__n4861::suspend_always::await_resume(this_05);
      kj::_::Coroutine<void>::~Coroutine(this_01);
      if (puVar2 != (undefined8 *)0x0) {
        operator_delete(puVar2,0x438);
      }
    }
    else {
      *puVar2 = 0;
      *(undefined1 *)((long)puVar2 + 0x434) = 2;
      _GLOBAL__N_1::HttpFixedLengthEntityWriter::write(this_05,__fd_00,__buf_02,(size_t)__n_00);
    }
  }
  else {
    *(undefined1 *)((long)puVar2 + 0x434) = 0;
    _GLOBAL__N_1::HttpFixedLengthEntityWriter::write(this_03,__fd_00,__buf_00,(size_t)__n_00);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    if (buffer == nullptr) co_return;
    KJ_REQUIRE(buffer.size() <= length, "overwrote Content-Length");
    length -= buffer.size();

    co_await getInner().writeBodyData(buffer);
    if (length == 0) doneWriting();
  }